

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::FindHelper<false,false>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  Var pvVar9;
  TypedArrayBase *pTVar10;
  undefined4 *puVar11;
  uint64 uVar12;
  uint64 uVar13;
  JavascriptMethod p_Var14;
  undefined4 extraout_var;
  char16_t *varName;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  RecyclableObject *local_a8;
  undefined1 local_98 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_68;
  Var element;
  int64 local_58;
  RecyclableObject *local_50;
  TypedArrayBase *local_48;
  ScriptContext *local_40;
  byte local_31;
  
  local_98 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_98)->noJsReentrancy;
  ((ThreadContext *)local_98)->noJsReentrancy = true;
  element = pArr;
  local_58 = length;
  local_50 = obj;
  local_48 = typedArrayBase;
  local_40 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_98,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00ba5fc3:
    varName = L"[TypedArray].prototype.find";
    if (local_48 == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.find";
    }
    JavascriptError::ThrowTypeError(local_40,-0x7ff5ec34,varName);
  }
  pvVar9 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar9);
  if (!bVar5) goto LAB_00ba5fc3;
  pvVar9 = Arguments::operator[](args,1);
  pTVar10 = (TypedArrayBase *)VarTo<Js::RecyclableObject>(pvVar9);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (element == (Var)0x0 && local_48 == (TypedArrayBase *)0x0) {
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(local_50);
    if (bVar5) {
      local_48 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(local_50);
    }
    else {
      local_48 = (TypedArrayBase *)0x0;
    }
  }
  local_68 = (RecyclableObject *)0x0;
  if (element == (Var)0x0) {
    if (local_48 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_a8 = (RecyclableObject *)
                 FindObjectHelper<false,false>
                           (local_50,local_58,0,(RecyclableObject *)pTVar10,(Var)jsReentLock._24_8_,
                            local_40);
      goto LAB_00ba5f97;
    }
    if (0xffffffff < local_58) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00ba5fe8;
      *puVar11 = 0;
    }
    element = (Var)CONCAT71(element._1_7_,0 < local_58);
    if (0 < local_58) {
      local_50 = (RecyclableObject *)__tls_get_addr(&PTR_0155fe48);
      uVar16 = 0;
      do {
        iVar8 = (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(local_48,uVar16);
        local_68 = (RecyclableObject *)CONCAT44(extraout_var,iVar8);
        if ((int)uVar16 < 0) {
          dVar4 = (double)uVar16;
          uVar12 = NumberUtilities::ToSpecial(dVar4);
          bVar5 = NumberUtilities::IsNan(dVar4);
          if (((bVar5) && (uVar13 = NumberUtilities::ToSpecial(dVar4), uVar13 != 0xfff8000000000000)
              ) && (uVar13 = NumberUtilities::ToSpecial(dVar4), uVar13 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)
             &(local_50->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00ba5fe8;
            *(undefined4 *)
             &(local_50->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 0;
          }
          uVar15 = uVar12 ^ 0xfffc000000000000;
        }
        else {
          uVar15 = uVar16 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_40->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_40->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)pTVar10);
        CheckIsExecutable((RecyclableObject *)pTVar10,p_Var14);
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)pTVar10);
        pvVar9 = (*p_Var14)((RecyclableObject *)pTVar10,(CallInfo)pTVar10,0x2000004,0,0,0,0,
                            0x2000004,jsReentLock._24_8_,local_68,uVar15,local_48);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_98);
        *(bool *)((long)local_98 + 0x108) = true;
        BVar7 = JavascriptConversion::ToBoolean(pvVar9,local_40);
        if (BVar7 != 0) {
          local_a8 = local_68;
          break;
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        element = (Var)CONCAT71(element._1_7_,(long)uVar16 < local_58);
      } while ((long)uVar16 < local_58);
    }
    bVar17 = (byte)element;
  }
  else {
    pRVar1 = (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    if (0xffffffff < local_58) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) {
LAB_00ba5fe8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    bVar17 = 0 < local_58;
    if (0 < local_58) {
      local_48 = pTVar10;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pTVar10 = local_48;
      uVar16 = 0;
      do {
        *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar8 = (int)uVar16;
        local_68 = pRVar1;
        local_31 = bVar17;
        (**(code **)(*element + 0x388))(element,uVar16,&local_68);
        JsReentLock::MutateArrayObject((JsReentLock *)local_98);
        *(bool *)((long)local_98 + 0x108) = true;
        if (iVar8 < 0) {
          dVar4 = (double)uVar16;
          uVar12 = NumberUtilities::ToSpecial(dVar4);
          bVar5 = NumberUtilities::IsNan(dVar4);
          if (((bVar5) && (uVar13 = NumberUtilities::ToSpecial(dVar4), uVar13 != 0xfff8000000000000)
              ) && (uVar13 = NumberUtilities::ToSpecial(dVar4), uVar13 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00ba5fe8;
            *puVar11 = 0;
          }
          uVar16 = uVar12 ^ 0xfffc000000000000;
        }
        else {
          uVar16 = uVar16 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_40->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_40->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)pTVar10);
        CheckIsExecutable((RecyclableObject *)pTVar10,p_Var14);
        p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)pTVar10);
        pvVar9 = (*p_Var14)((RecyclableObject *)pTVar10,(CallInfo)pTVar10,0x2000004,0,0,0,0,
                            0x2000004,jsReentLock._24_8_,local_68,uVar16,element);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_98);
        *(bool *)((long)local_98 + 0x108) = true;
        BVar7 = JavascriptConversion::ToBoolean(pvVar9,local_40);
        if (BVar7 == 0) {
          bVar6 = IsNonES5Array(local_50);
          bVar5 = true;
          if (!bVar6) {
            bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_50);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar11 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2141,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00ba5fe8;
              *puVar11 = 0;
            }
            *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_a8 = (RecyclableObject *)
                       FindObjectHelper<false,false>
                                 (local_50,local_58,(ulong)(iVar8 + 1),(RecyclableObject *)local_48,
                                  (Var)jsReentLock._24_8_,local_40);
            goto LAB_00ba5cc4;
          }
        }
        else {
          local_a8 = local_68;
LAB_00ba5cc4:
          bVar5 = false;
        }
        bVar17 = local_31;
        if (!bVar5) break;
        uVar16 = (ulong)(iVar8 + 1);
        bVar17 = (long)uVar16 < local_58;
      } while ((long)uVar16 < local_58);
    }
  }
  if ((bVar17 & 1) == 0) {
    local_a8 = (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).undefinedValue.ptr;
  }
LAB_00ba5f97:
  *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_a8;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }